

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

bool __thiscall OpenMD::MoleculeStamp::addBendStamp(MoleculeStamp *this,BendStamp *bend)

{
  BendStamp *local_8;
  
  local_8 = bend;
  std::vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>::push_back
            (&this->bendStamps_,&local_8);
  return true;
}

Assistant:

bool MoleculeStamp::addBendStamp(BendStamp* bend) {
    bendStamps_.push_back(bend);
    return true;
  }